

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_threshold.hpp
# Opt level: O2

void re::math::adaptive_threshold<7l,float,512l,512l>
               (span<const_float,_512L> in,span<float,_512L> out)

{
  float *pfVar1;
  float __x;
  long lVar2;
  int i;
  ulong uVar3;
  float fVar4;
  float fVar5;
  ring_array<float,_7UL> temp;
  float *local_58;
  float local_50 [7];
  float local_34;
  
  fVar5 = 0.0;
  uVar3 = 0;
  lVar2 = 0;
  local_58 = local_50;
  do {
    if (uVar3 == 0x207) {
      return;
    }
    if (uVar3 < 0x200) {
      fVar5 = fVar5 + *(float *)((long)in.storage_.data_ + uVar3 * 4);
      lVar2 = lVar2 + 1;
      if (6 < uVar3) goto LAB_00105389;
    }
    else {
LAB_00105389:
      __x = *(float *)((long)in.storage_.data_ + -0x1c + uVar3 * 4);
      fVar4 = fdimf(__x,fVar5 / (float)lVar2);
      *(float *)((long)out.storage_.data_ + -0x1c + uVar3 * 4) = fVar4;
      if (0xe < uVar3) {
        fVar5 = fVar5 - *local_58;
        lVar2 = lVar2 + -1;
      }
      pfVar1 = local_58 + 1;
      *local_58 = __x;
      local_58 = pfVar1;
      if (pfVar1 == &local_34) {
        local_58 = local_50;
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void
adaptive_threshold(
    gsl::span<T const, N_in> in,
    gsl::span<T, N_out> out
) noexcept {
    assert(std::size(in) == std::size(out));
    auto const n = std::size(in);

    assert(n >= 2*Radius);
    T sum = 0;
    int_t count = 0;
    ring_array<T, Radius> temp;

    for (auto i = 0; i < n + Radius; ++i) {
        if (i < n) {
            sum += in[i];
            ++count;
        }
        if (i >= Radius) {
            auto const in_value = in[i - Radius];
            out[i - Radius] = std::fdim(in_value, sum / count);
            if (i > 2*Radius) {
                sum -= temp.front();
                --count;
            }
            temp.push_back(in_value);
        }
    }
}